

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprIsSingleTableConstraint(Expr *pExpr,SrcList *pSrcList,int iSrc,int bAllowSubq)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long in_FS_OFFSET;
  Walker local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = pSrcList->a[iSrc].fg.jointype;
  uVar2 = 0;
  uVar3 = 0;
  if ((bVar1 & 0x40) == 0) {
    uVar3 = uVar2;
    if ((bVar1 & 8) == 0) {
      if ((pExpr->flags & 1) != 0) goto LAB_001938e9;
    }
    else if (((pExpr->flags & 1) == 0) || ((pExpr->w).iJoin != pSrcList->a[iSrc].iCursor))
    goto LAB_001938e9;
    if (((pExpr->flags & 3) != 0) && (0 < iSrc && (pSrcList->a[0].fg.jointype & 0x40) != 0)) {
      lVar4 = 0;
      do {
        if ((pExpr->w).iJoin == *(int *)((long)&pSrcList->a[0].iCursor + lVar4)) {
          uVar3 = 0;
          if (((&pSrcList->a[0].fg.jointype)[lVar4] & 0x40) != 0) goto LAB_001938e9;
          break;
        }
        lVar4 = lVar4 + 0x48;
      } while ((ulong)(uint)iSrc * 0x48 != lVar4);
    }
    local_38.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.walkerDepth = -0x55555556;
    local_38.eCode = 3;
    local_38.mWFlags = 0xaaaa;
    local_38.pParse = (Parse *)0x0;
    local_38.xSelectCallback = exprSelectWalkTableConstant;
    if (bAllowSubq == 0) {
      local_38.xSelectCallback = sqlite3SelectWalkFail;
    }
    local_38.xExprCallback = exprNodeIsConstant;
    local_38.u._4_4_ = 0xaaaaaaaa;
    local_38.u.n = pSrcList->a[iSrc].iCursor;
    if (pExpr != (Expr *)0x0) {
      sqlite3WalkExprNN(&local_38,pExpr);
    }
    uVar3 = (uint)local_38.eCode;
  }
LAB_001938e9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsSingleTableConstraint(
  Expr *pExpr,                 /* The constraint */
  const SrcList *pSrcList,     /* Complete FROM clause */
  int iSrc,                    /* Which element of pSrcList to use */
  int bAllowSubq               /* Allow non-correlated subqueries */
){
  const SrcItem *pSrc = &pSrcList->a[iSrc];
  if( pSrc->fg.jointype & JT_LTORJ ){
    return 0;  /* rule (3) */
  }
  if( pSrc->fg.jointype & JT_LEFT ){
    if( !ExprHasProperty(pExpr, EP_OuterON) ) return 0;   /* rule (4a) */
    if( pExpr->w.iJoin!=pSrc->iCursor ) return 0;         /* rule (4b) */
  }else{
    if( ExprHasProperty(pExpr, EP_OuterON) ) return 0;    /* rule (5) */
  }
  if( ExprHasProperty(pExpr, EP_OuterON|EP_InnerON)  /* (6a) */
   && (pSrcList->a[0].fg.jointype & JT_LTORJ)!=0     /* Fast pre-test of (6b) */
  ){
    int jj;
    for(jj=0; jj<iSrc; jj++){
      if( pExpr->w.iJoin==pSrcList->a[jj].iCursor ){
        if( (pSrcList->a[jj].fg.jointype & JT_LTORJ)!=0 ){
          return 0;  /* restriction (6) */
        }
        break;
      }
    }
  }
  /* Rules (1), (2a), and (2b) handled by the following: */
  return sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor, bAllowSubq);
}